

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  bool bVar1;
  char *pcVar2;
  string var;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  switch(this->Target->TargetTypeValue) {
  case EXECUTABLE:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_68,"_LINK_EXECUTABLE");
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_48,"CMAKE_",lang);
    std::operator+(&local_68,&local_48,"_CREATE_STATIC_LIBRARY");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_48,"INTERPROCEDURAL_OPTIMIZATION",&local_69);
    bVar1 = GetFeatureAsBool(this,&local_48,config);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::operator+(__return_storage_ptr__,&local_68,"_IPO");
      pcVar2 = cmMakefile::GetDefinition(this->Makefile,__return_storage_ptr__);
      if (pcVar2 != (char *)0x0) break;
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_68._M_string_length;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    break;
  case SHARED_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_68,"_CREATE_SHARED_LIBRARY");
    break;
  case MODULE_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_68,"_CREATE_SHARED_MODULE");
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_68);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetCreateRuleVariable(std::string const& lang,
                                         std::string const& config) const
{
  switch(this->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      if(this->GetFeatureAsBool(
           "INTERPROCEDURAL_OPTIMIZATION", config))
        {
        std::string varIPO = var + "_IPO";
        if(this->Makefile->GetDefinition(varIPO))
          {
          return varIPO;
          }
        }
      return var;
      }
    case cmTarget::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmTarget::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmTarget::EXECUTABLE:
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
    }
  return "";
}